

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitSelect(I64ToI32Lowering *this,Select *curr)

{
  unordered_map<wasm::Expression_*,_wasm::I64ToI32Lowering::TempVar,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>_>
  *this_00;
  Builder *this_01;
  Builder *pBVar1;
  Builder *pBVar2;
  undefined4 uVar3;
  Index IVar4;
  bool bVar5;
  iterator iVar6;
  LocalSet *any;
  Expression *pEVar7;
  Select *pSVar8;
  LocalSet *append;
  Expression *pEVar9;
  Expression *pEVar10;
  LocalSet *args;
  LocalGet *args_1;
  Block *expression;
  TempVar local_118;
  TempVar local_f8;
  undefined1 local_d8 [8];
  TempVar lowBits;
  undefined1 local_98 [8];
  TempVar highBits;
  TempVar cond;
  
  bVar5 = handleUnreachable(this,(Expression *)curr);
  if (!bVar5) {
    local_98 = (undefined1  [8])curr->ifTrue;
    this_00 = &this->highBitVars;
    iVar6 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,(key_type *)local_98);
    local_98 = (undefined1  [8])curr->ifFalse;
    if (iVar6.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
        ._M_cur != (__node_type *)0x0) {
      iVar6 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)local_98);
      if (iVar6.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("hasOutParam(curr->ifFalse)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x61c,"void wasm::I64ToI32Lowering::visitSelect(Select *)");
      }
      getTemp((TempVar *)local_98,this,(Type)0x2);
      getTemp((TempVar *)local_d8,this,(Type)0x2);
      getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
      lowBits.ty.id = (uintptr_t)this_00;
      if ((char)cond.pass != '\x01') {
        this_01 = (this->builder)._M_t.
                  super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                  super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        any = Builder::makeLocalSet(this_01,(Index)highBits.ty.id,curr->condition);
        IVar4 = (Index)highBits.ty.id;
        uVar3 = local_d8._0_4_;
        if (((char)lowBits.pass != '\x01') && ((char)cond.pass != '\x01')) {
          pBVar1 = (this->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          pEVar7 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
          pEVar7->_id = LocalGetId;
          *(Index *)(pEVar7 + 1) = IVar4;
          (pEVar7->type).id = 2;
          pEVar9 = curr->ifTrue;
          pEVar10 = curr->ifFalse;
          pSVar8 = (Select *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
          (pSVar8->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id =
               SelectId;
          (pSVar8->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id = 0;
          pSVar8->condition = pEVar7;
          pSVar8->ifTrue = pEVar9;
          pSVar8->ifFalse = pEVar10;
          Select::finalize(pSVar8);
          append = Builder::makeLocalSet(pBVar1,uVar3,(Expression *)pSVar8);
          if (((char)highBits.pass != '\x01') && ((char)cond.pass != '\x01')) {
            pBVar1 = (this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
            uVar3 = local_98._0_4_;
            pEVar9 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
            pEVar9->_id = LocalGetId;
            *(Index *)(pEVar9 + 1) = (Index)highBits.ty.id;
            (pEVar9->type).id = 2;
            pBVar2 = (this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
            fetchOutParam(&local_f8,this,curr->ifTrue);
            if (local_f8.moved != true) {
              pEVar10 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
              pEVar10->_id = LocalGetId;
              *(Index *)(pEVar10 + 1) = local_f8.idx;
              (pEVar10->type).id = 2;
              pBVar2 = (this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
              fetchOutParam(&local_118,this,curr->ifFalse);
              if (local_118.moved != true) {
                pEVar7 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
                pEVar7->_id = LocalGetId;
                *(Index *)(pEVar7 + 1) = local_118.idx;
                (pEVar7->type).id = 2;
                pSVar8 = (Select *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
                (pSVar8->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id =
                     SelectId;
                (pSVar8->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.
                id = 0;
                pSVar8->condition = pEVar9;
                pSVar8->ifTrue = pEVar10;
                pSVar8->ifFalse = pEVar7;
                Select::finalize(pSVar8);
                args = Builder::makeLocalSet(pBVar1,uVar3,(Expression *)pSVar8);
                if ((char)lowBits.pass != '\x01') {
                  args_1 = (LocalGet *)
                           MixedArena::allocSpace
                                     (&((this->builder)._M_t.
                                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)
                                       ->wasm->allocator,0x18,8);
                  (args_1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id =
                       LocalGetId;
                  args_1->index = local_d8._0_4_;
                  (args_1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.
                  id = 2;
                  expression = Builder::blockify<wasm::LocalSet*,wasm::LocalGet*>
                                         (this_01,(Expression *)any,(Expression *)append,args,args_1
                                         );
                  TempVar::~TempVar(&local_118);
                  TempVar::~TempVar(&local_f8);
                  local_f8._0_8_ = expression;
                  std::
                  _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                            ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)lowBits.ty.id,&local_f8,local_98);
                  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::
                  replaceCurrent(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                  .
                                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 ,(Expression *)expression);
                  TempVar::~TempVar((TempVar *)&highBits.ty);
                  TempVar::~TempVar((TempVar *)local_d8);
                  TempVar::~TempVar((TempVar *)local_98);
                  return;
                }
              }
            }
          }
        }
      }
      __assert_fail("!moved",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
    }
    iVar6 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,(key_type *)local_98);
    if (iVar6.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
        ._M_cur != (__node_type *)0x0) {
      __assert_fail("!hasOutParam(curr->ifFalse)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x619,"void wasm::I64ToI32Lowering::visitSelect(Select *)");
    }
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (!hasOutParam(curr->ifTrue)) {
      assert(!hasOutParam(curr->ifFalse));
      return;
    }
    assert(hasOutParam(curr->ifFalse));
    TempVar highBits = getTemp();
    TempVar lowBits = getTemp();
    TempVar cond = getTemp();
    Block* result = builder->blockify(
      builder->makeLocalSet(cond, curr->condition),
      builder->makeLocalSet(
        lowBits,
        builder->makeSelect(
          builder->makeLocalGet(cond, Type::i32), curr->ifTrue, curr->ifFalse)),
      builder->makeLocalSet(
        highBits,
        builder->makeSelect(
          builder->makeLocalGet(cond, Type::i32),
          builder->makeLocalGet(fetchOutParam(curr->ifTrue), Type::i32),
          builder->makeLocalGet(fetchOutParam(curr->ifFalse), Type::i32))),
      builder->makeLocalGet(lowBits, Type::i32));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }